

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

int mpc_boundary_anchor(char prev,char next)

{
  bool bVar1;
  void *pvVar2;
  void *pvVar3;
  uint uVar4;
  undefined7 in_register_00000031;
  
  pvVar2 = memchr("abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789_",
                  (int)CONCAT71(in_register_00000031,next),0x40);
  uVar4 = 1;
  if (prev != '\0' || pvVar2 == (void *)0x0) {
    pvVar3 = memchr("abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789_",(int)prev,0x40
                   );
    bVar1 = next != '\0';
    if (pvVar3 == (void *)0x0) {
      bVar1 = pvVar2 == (void *)0x0;
    }
    if (bVar1) {
      uVar4 = (uint)(pvVar3 != (void *)0x0 && pvVar2 == (void *)0x0);
    }
  }
  return uVar4;
}

Assistant:

static int mpc_boundary_anchor(char prev, char next) {
  const char* word = "abcdefghijklmnopqrstuvwxyz"
                     "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                     "0123456789_";
  if ( strchr(word, next) &&  prev == '\0') { return 1; }
  if ( strchr(word, prev) &&  next == '\0') { return 1; }
  if ( strchr(word, next) && !strchr(word, prev)) { return 1; }
  if (!strchr(word, next) &&  strchr(word, prev)) { return 1; }
  return 0;
}